

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::VisitDescriptorsTest_AllTypesDeduceDelegate_Test::TestBody
          (VisitDescriptorsTest_AllTypesDeduceDelegate_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  char *message;
  size_type in_RCX;
  initializer_list<const_char_*> xs;
  AssertHelper local_1c0;
  Message local_1b8;
  char *local_1b0;
  char *local_1a8;
  testing *local_1a0;
  undefined8 local_198;
  UnorderedElementsAreArrayMatcher<const_char_*> local_190;
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>_>
  local_170;
  undefined1 local_150 [8];
  AssertionResult gtest_ar;
  undefined1 local_138 [8];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  descriptors;
  undefined1 local_110 [8];
  FileDescriptorProto proto;
  FileDescriptor *file;
  VisitDescriptorsTest_AllTypesDeduceDelegate_Test *this_local;
  UnorderedElementsAreArrayMatcher<const_char_*> *matcher;
  
  this_00 = proto2_unittest::TestAllTypes::GetDescriptor();
  proto.field_0._224_8_ = Descriptor::file(this_00);
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_110);
  FileDescriptor::CopyTo((FileDescriptor *)proto.field_0._224_8_,(FileDescriptorProto *)local_110);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)local_138);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )local_138;
  internal::
  VisitDescriptors<google::protobuf::(anonymous_namespace)::VisitDescriptorsTest_AllTypesDeduceDelegate_Test::TestBody()::__0>
            ((FileDescriptor *)proto.field_0._224_8_,(FileDescriptorProto *)local_110,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)local_138);
  local_1b0 = "proto2_unittest.TestAllTypes";
  local_1a8 = "proto2_unittest.TestSparseEnum";
  local_1a0 = (testing *)&local_1b0;
  local_198 = 2;
  xs._M_len = in_RCX;
  xs._M_array = (iterator)0x2;
  testing::IsSupersetOf<char_const*>(&local_190,local_1a0,xs);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>
            (&local_170,(internal *)&local_190,matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<char_const*>>::
  operator()(local_150,(char *)&local_170,
             (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x1f35024);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>_>
  ::~PredicateFormatterFromMatcher(&local_170);
  testing::internal::UnorderedElementsAreArrayMatcher<const_char_*>::
  ~UnorderedElementsAreArrayMatcher(&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_visitor_test.cc"
               ,0x8a,message);
    testing::internal::AssertHelper::operator=(&local_1c0,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_138);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_110);
  return;
}

Assistant:

TEST(VisitDescriptorsTest, AllTypesDeduceDelegate) {
  const FileDescriptor& file =
      *proto2_unittest::TestAllTypes::GetDescriptor()->file();
  FileDescriptorProto proto;
  file.CopyTo(&proto);
  std::vector<absl::string_view> descriptors;

  VisitDescriptors(file, proto,
                   [&](const auto& descriptor, const auto& proto)
                       -> decltype(TestHandle(descriptor, proto, nullptr)) {
                     TestHandle(descriptor, proto, &descriptors);
                   });

  EXPECT_THAT(descriptors, IsSupersetOf({"proto2_unittest.TestAllTypes",
                                         "proto2_unittest.TestSparseEnum"}));
}